

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  shared_container_t *container;
  long lVar1;
  container_t *c;
  int *c_00;
  int *piVar2;
  uint8_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint start_index;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t uVar9;
  uint16_t key;
  bool bVar10;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_52;
  uint8_t local_51;
  uint local_50;
  uint local_4c;
  ulong local_48;
  int *local_40;
  roaring_array_t *local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3e2f,
                  "void roaring_bitmap_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)");
  }
  local_51 = '\0';
  local_50 = (x2->high_low_container).size;
  if (local_50 == 0) {
    return;
  }
  uVar5 = (x1->high_low_container).size;
  uVar4 = (ulong)uVar5;
  if (uVar5 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar9 = *(x1->high_low_container).keys;
  key = *(x2->high_low_container).keys;
  uVar8 = 0;
  uVar6 = 0;
LAB_00117dd1:
  do {
    start_index = (uint)uVar6;
    uVar8 = (ulong)(int)uVar8;
    uVar5 = (int)uVar4 - 1;
    while( true ) {
      uVar7 = (uint)uVar8;
      if (uVar9 == key) break;
      if (key <= uVar9) {
        local_52 = (x2->high_low_container).typecodes[uVar6 & 0xffff];
        local_48 = uVar4;
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar6 & 0xffff],&local_52,
                       (_Bool)((x2->high_low_container).flags & 1));
        if (((x2->high_low_container).flags & 1) != 0) {
          if ((x2->high_low_container).size <= (int)start_index) goto LAB_001180a5;
          (x2->high_low_container).containers[(int)start_index] = c;
          (x2->high_low_container).typecodes[(int)start_index] = local_52;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar7,key,c,local_52);
        start_index = start_index + 1;
        uVar6 = (ulong)start_index;
        if (start_index != local_50) {
          key = (x2->high_low_container).keys[uVar6 & 0xffff];
        }
        uVar4 = (ulong)((int)local_48 + 1);
        if (start_index == local_50) {
LAB_00118038:
          uVar7 = uVar7 + 1;
          goto LAB_0011803b;
        }
        uVar8 = uVar8 + 1;
        goto LAB_00117dd1;
      }
      if (uVar5 == uVar7) goto LAB_00118038;
      uVar8 = uVar8 + 1;
      uVar9 = (x1->high_low_container).keys[uVar8 & 0xffff];
    }
    uVar3 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
    container = (shared_container_t *)(x1->high_low_container).containers[uVar8 & 0xffff];
    local_52 = (x2->high_low_container).typecodes[uVar6 & 0xffff];
    local_4c = start_index;
    local_38 = &x2->high_low_container;
    if (uVar3 == '\x04') {
      local_48 = uVar4;
      local_40 = (int *)container_xor(container,'\x04',
                                      (x2->high_low_container).containers[uVar6 & 0xffff],local_52,
                                      &local_51);
      shared_container_free(container);
      c_00 = local_40;
    }
    else {
      local_48 = uVar4;
      c_00 = (int *)container_ixor(container,uVar3,
                                   (x2->high_low_container).containers[uVar6 & 0xffff],local_52,
                                   &local_51);
    }
    x2 = (roaring_bitmap_t *)local_38;
    piVar2 = c_00;
    uVar3 = local_51;
    if (local_51 == '\x04') {
      uVar3 = (uint8_t)c_00[2];
      if (uVar3 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar2 = *(int **)c_00;
    }
    if ((uVar3 == '\x03') || (uVar3 == '\x02')) {
      bVar10 = 0 < *piVar2;
    }
    else {
      if (uVar3 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (*piVar2 == -1) {
        if (**(long **)(piVar2 + 2) == 0) {
          uVar4 = 0xffffffffffffffff;
          do {
            if (uVar4 == 0x3fe) {
              uVar6 = 0x3ff;
              break;
            }
            uVar6 = uVar4 + 1;
            lVar1 = uVar4 + 2;
            uVar4 = uVar6;
          } while ((*(long **)(piVar2 + 2))[lVar1] == 0);
          bVar10 = 0x3fe < uVar6;
        }
        else {
          bVar10 = false;
        }
      }
      else {
        bVar10 = *piVar2 == 0;
      }
      bVar10 = (bool)(bVar10 ^ 1);
    }
    if (bVar10) {
      if ((x1->high_low_container).size <= (int)uVar7) {
LAB_001180a5:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (x1->high_low_container).containers[uVar8] = c_00;
      (x1->high_low_container).typecodes[uVar8] = local_51;
      uVar8 = (ulong)(uVar7 + 1);
      uVar4 = local_48;
    }
    else {
      container_free(c_00,local_51);
      ra_remove_at_index(&x1->high_low_container,uVar7);
      uVar4 = (ulong)uVar5;
    }
    start_index = local_4c + 1;
    uVar6 = (ulong)start_index;
    uVar7 = (uint)uVar8;
    if (start_index == local_50 || uVar7 == (uint)uVar4) {
LAB_0011803b:
      if (uVar7 != (uint)uVar4) {
        return;
      }
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,start_index,local_50,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    uVar9 = (x1->high_low_container).keys[uVar7 & 0xffff];
    key = (x2->high_low_container).keys[start_index & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_xor_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }

    // XOR can have new containers inserted from x2, but can also
    // lose containers when x1 and x2 are nonempty and identical.

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // so release
            }
            else {
                c = container_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }

            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}